

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall
QXmlStreamReaderPrivate::putReplacementInAttributeValue(QXmlStreamReaderPrivate *this,QStringView s)

{
  ushort uVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  const_reverse_iterator end;
  long lVar7;
  long lVar8;
  
  lVar8 = s.m_size;
  lVar2 = (this->putStack).tos + lVar8;
  lVar4 = (this->putStack).cap;
  if (lVar4 <= lVar2) {
    lVar2 = lVar2 + 1;
    lVar7 = lVar4 * 2;
    if (lVar2 != lVar7 && SBORROW8(lVar2,lVar7) == lVar2 + lVar4 * -2 < 0) {
      lVar7 = lVar2;
    }
    (this->putStack).cap = lVar7;
    puVar3 = (uint *)realloc((this->putStack).data,lVar7 << 2);
    (this->putStack).data = puVar3;
    if (puVar3 == (uint *)0x0) {
      qBadAlloc();
    }
  }
  if (lVar8 != 0) {
    puVar3 = (this->putStack).data;
    lVar4 = (this->putStack).tos;
    lVar8 = lVar8 * 2;
    do {
      uVar1 = *(ushort *)((long)s.m_data + lVar8 + -2);
      uVar6 = (uint)uVar1;
      uVar5 = (uint)uVar1;
      if (uVar1 < 0x26) {
        if ((uVar5 == 10) || (uVar5 == 0xd)) {
          uVar6 = 0x20;
        }
        else {
LAB_0039e808:
          uVar6 = uVar5 | 0x1a0000;
        }
      }
      else if ((uVar1 != 0x26) && (uVar5 != 0x3b)) goto LAB_0039e808;
      puVar3[lVar4 + 1] = uVar6;
      lVar4 = lVar4 + 1;
      lVar8 = lVar8 + -2;
    } while (lVar8 != 0);
    (this->putStack).tos = lVar4;
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::putReplacementInAttributeValue(QStringView s)
{
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it) {
        char16_t c = it->unicode();
        if (c == '&' || c == ';')
            putStack.rawPush() = c;
        else if (c == '\n' || c == '\r')
            putStack.rawPush() = ' ';
        else
            putStack.rawPush() = ((LETTER << 16) | c);
    }
}